

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_point_3d * mg_point_3d_copy(mg_point_3d *point_3d)

{
  int64_t iVar1;
  double dVar2;
  double dVar3;
  mg_point_3d *pmVar4;
  
  if ((point_3d != (mg_point_3d *)0x0) &&
     (pmVar4 = (mg_point_3d *)mg_allocator_malloc(&mg_system_allocator,0x20),
     pmVar4 != (mg_point_3d *)0x0)) {
    iVar1 = point_3d->srid;
    dVar2 = point_3d->x;
    dVar3 = point_3d->z;
    pmVar4->y = point_3d->y;
    pmVar4->z = dVar3;
    pmVar4->srid = iVar1;
    pmVar4->x = dVar2;
    return pmVar4;
  }
  return (mg_point_3d *)0x0;
}

Assistant:

mg_point_3d *mg_point_3d_copy_ca(const mg_point_3d *src,
                                 mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_point_3d *point_3d = mg_point_3d_alloc(allocator);
  if (!point_3d) {
    return NULL;
  }
  memcpy(point_3d, src, sizeof(mg_point_3d));
  return point_3d;
}